

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  _Rb_tree_node_base *p_Var2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  const_iterator cVar7;
  char *pcVar8;
  size_t sVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 extraout_RAX;
  _Rb_tree_header *p_Var11;
  ostream *poVar12;
  char *pcVar13;
  Message errors;
  string name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  allocator<char> local_b9;
  key_type local_b8;
  TypedTestCasePState *local_98;
  uint local_8c;
  internal *local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  *this = (TypedTestCasePState)0x1;
  pcVar13 = registered_tests + -1;
  local_98 = this;
  local_8c = line;
  local_88 = (internal *)file;
  do {
    pbVar1 = (byte *)(pcVar13 + 1);
    pcVar13 = pcVar13 + 1;
    iVar4 = isspace((uint)*pbVar1);
  } while (iVar4 != 0);
  Message::Message((Message *)&local_c8);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (_Rb_tree_node_base *)(local_98 + 0x10);
  pcVar8 = pcVar13;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pcVar6 = strchr(pcVar8,0x2c);
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar8,&local_b9);
    }
    else {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar8,pcVar6);
    }
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_80,&local_b8);
    p_Var11 = &local_80._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar7._M_node == p_Var11) {
      for (p_Var10 = *(_Rb_tree_node_base **)(local_98 + 0x20); p_Var10 != p_Var2;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar4 == 0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_80,&local_b8);
          goto LAB_0012e240;
        }
      }
      poVar12 = (ostream *)(local_c8.ptr_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"No test named ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," can be found in this test case.\n",0x21);
    }
    else {
      poVar12 = (ostream *)(local_c8.ptr_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Test ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," is listed more than once.\n",0x1b);
    }
LAB_0012e240:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pcVar8 = strchr(pcVar8,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar4 = isspace((uint)*pbVar1);
      } while (iVar4 != 0);
    }
    iVar4 = (int)p_Var11;
    if (pcVar8 == (char *)0x0) {
      p_Var10 = *(_Rb_tree_node_base **)(local_98 + 0x20);
      if (p_Var10 != p_Var2) {
        poVar12 = (ostream *)(local_c8.ptr_ + 0x10);
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,*(char **)(p_Var10 + 1),(allocator<char> *)&local_50);
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_80,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)cVar7._M_node == &local_80._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"You forgot to list test ",0x18);
            pcVar8 = *(char **)(p_Var10 + 1);
            if (pcVar8 == (char *)0x0) {
              sVar9 = 6;
              pcVar8 = "(null)";
            }
            else {
              sVar9 = strlen(pcVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar8,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          iVar4 = (int)p_Var11;
        } while (p_Var10 != p_Var2);
      }
      sVar3.ptr_ = local_c8.ptr_;
      StringStreamToString(&local_b8,local_c8.ptr_);
      iVar5 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar5 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_80);
        if (sVar3.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)sVar3.ptr_ + 8))(sVar3.ptr_);
        }
        return pcVar13;
      }
      FormatFileLocation_abi_cxx11_(&local_50,local_88,(char *)(ulong)local_8c,iVar4);
      VerifyRegisteredTestNames();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_80);
      if (local_c8.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
        local_c8.ptr_ = (stringstream *)0x0;
      }
      _Unwind_Resume(extraout_RAX);
    }
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<std::string> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const std::string name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}